

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_int>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_int>_>
         *this)

{
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  int iVar4;
  Samplings<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<float> *pVVar8;
  pointer pcVar9;
  Variable<int> *pVVar10;
  double **ppdVar11;
  TestStatus *pTVar12;
  pointer pfVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  undefined8 uVar17;
  IVal *pIVar18;
  IVal *x;
  undefined8 *puVar19;
  IVal IVar20;
  FloatFormat *pFVar21;
  char *pcVar22;
  undefined1 auVar23 [8];
  long lVar24;
  long lVar25;
  double dVar26;
  double dVar27;
  FuncSet funcs;
  IVal in1;
  IVal in2;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_> outputs;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  FloatFormat highpFmt;
  ResultCollector status;
  uint in_stack_fffffffffffffa98;
  undefined4 uStack_564;
  undefined8 local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Rb_tree_node_base *local_548;
  size_t local_540;
  string local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  size_t local_510;
  IVal local_508;
  IVal local_4e8;
  FloatFormat *local_4d0;
  long local_4c8;
  TestStatus *local_4c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4b8;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_> local_488;
  undefined1 local_458 [8];
  double dStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  double local_438;
  Precision local_430;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_428;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [264];
  pointer local_2d8;
  pointer local_2d0;
  Inputs<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_2c8;
  pointer local_268;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  IVal local_240;
  undefined4 uStack_228;
  undefined4 uStack_224;
  ios_base local_1d0 [264];
  _Base_ptr local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  FloatFormat local_a8;
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  pFVar21 = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_4c0 = __return_storage_ptr__;
  iVar16 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d0 = pFVar21;
  generateInputs<vkt::shaderexecutor::InTypes<float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_2c8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar21,(FloatFormat *)(ulong)PVar3,(Precision)sVar5,(ulong)(iVar16 + 0xdeadbeef),
             in_stack_fffffffffffffa98);
  pfVar13 = local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_510 = (long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  Outputs<vkt::shaderexecutor::OutTypes<float,_int>_>::Outputs(&local_488,local_510);
  local_a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b8._M_impl.super__Rb_tree_header._M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_518 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_268 = local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_260 = local_2c8.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_258 = local_2c8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_250 = local_2c8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2d8 = local_488.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2d0 = local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_458 = (undefined1  [8])local_518;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_450,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
  local_560 = (double)((ulong)local_560._4_4_ << 0x20);
  local_558._M_allocated_capacity = 0;
  local_540 = 0;
  pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_558._8_8_ = (_Rb_tree_node_base *)&local_560;
  local_548 = (_Rb_tree_node_base *)&local_560;
  (*pSVar6->_vptr_Statement[4])(pSVar6,&stack0xfffffffffffffa98);
  if ((_Rb_tree_node_base *)local_558._8_8_ != (_Rb_tree_node_base *)&local_560) {
    uVar17 = local_558._8_8_;
    do {
      (**(code **)(**(long **)(uVar17 + 0x20) + 0x30))(*(long **)(uVar17 + 0x20),&local_240);
      uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17);
    } while ((_Rb_tree_node_base *)uVar17 != (_Rb_tree_node_base *)&local_560);
  }
  pFVar21 = local_4d0;
  if (local_540 != 0) {
    local_458 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_450,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_450,local_538._M_dataplus._M_p,local_538._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)&stack0xfffffffffffffa98);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
  std::ios_base::~ios_base(local_1d0);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_510,&local_268,&local_2d8,0);
  local_458 = (undefined1  [8])((ulong)local_458 & 0xffffffffffffff00);
  dStack_450 = INFINITY;
  local_448._M_allocated_capacity = 0xfff0000000000000;
  local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
  local_240.m_lo = INFINITY;
  local_240.m_hi = -INFINITY;
  in_stack_fffffffffffffa98 = in_stack_fffffffffffffa98 & 0xffffff00;
  local_560 = INFINITY;
  local_558._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_4b8,
             (this->m_variables).in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_458);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_538);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_508);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<float>
            ((Environment *)&local_4b8,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,&local_240);
  Environment::bind<int>
            ((Environment *)&local_4b8,
             (this->m_variables).out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffa98);
  if (local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish == pfVar13) {
    iVar16 = 0;
  }
  else {
    lVar24 = local_510 + (local_510 == 0);
    lVar25 = 0;
    iVar16 = 0;
    do {
      local_508._0_8_ = local_508._0_8_ & 0xffffffffffffff00;
      local_508.m_lo = INFINITY;
      local_508.m_hi = -INFINITY;
      local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
      local_4e8.m_lo = INFINITY;
      local_4e8.m_hi = -INFINITY;
      dVar27 = (double)*(float *)((long)local_2c8.in0.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar25);
      bVar14 = NAN(*(float *)((long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar25));
      local_458[0] = bVar14;
      dStack_450 = INFINITY;
      if (!bVar14) {
        dStack_450 = dVar27;
      }
      local_448._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar14) {
        local_448._M_allocated_capacity = (size_type)dVar27;
      }
      local_4c8 = lVar24;
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffa98,pFVar21,(Interval *)local_458,false);
      tcu::FloatFormat::convert(&local_240,pFVar21,(Interval *)&stack0xfffffffffffffa98);
      pIVar18 = Environment::lookup<float>
                          ((Environment *)&local_4b8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar18->m_hi = local_240.m_hi;
      pIVar18->m_hasNaN = local_240.m_hasNaN;
      *(undefined7 *)&pIVar18->field_0x1 = local_240._1_7_;
      pIVar18->m_lo = local_240.m_lo;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4b8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4b8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4b8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_430 = (this->m_caseCtx).precision;
      local_438 = pFVar21->m_maxValue;
      local_458 = *(undefined1 (*) [8])pFVar21;
      dStack_450 = *(double *)&pFVar21->m_fractionBits;
      local_448._M_allocated_capacity = *(undefined8 *)&pFVar21->m_hasInf;
      local_448._8_1_ = pFVar21->m_exactPrecision;
      local_448._9_7_ = *(undefined7 *)&pFVar21->field_0x19;
      local_420 = 0;
      pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_428 = &local_4b8;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(string *)local_458);
      x = Environment::lookup<int>
                    ((Environment *)&local_4b8,
                     (this->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_458,&local_a8,x);
      local_4e8.m_hi = (double)local_448._M_allocated_capacity;
      local_4e8._0_8_ = local_458;
      local_4e8.m_lo = dStack_450;
      iVar4 = *(int *)((long)local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar25);
      local_b8 = dStack_450;
      uStack_b0 = 0;
      local_c8 = (_Base_ptr)local_448._M_allocated_capacity;
      uStack_c0 = 0;
      local_458 = (undefined1  [8])&local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,"Shader output 1 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check
                         (&local_80,
                          (bool)(-((double)iVar4 <= (double)local_c8) & -(local_b8 <= (double)iVar4)
                                & 1),(string *)local_458);
      if (local_458 != (undefined1  [8])&local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
      }
      pIVar18 = Environment::lookup<float>
                          ((Environment *)&local_4b8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_458,&local_a8,pIVar18);
      local_508.m_hi = (double)local_448._M_allocated_capacity;
      local_508._0_8_ = local_458;
      uVar17 = local_508._0_8_;
      local_508.m_lo = dStack_450;
      fVar2 = *(float *)((long)local_488.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar25);
      dVar26 = (double)fVar2;
      dVar27 = dVar26;
      if (NAN(fVar2)) {
        dVar27 = INFINITY;
        dVar26 = -INFINITY;
      }
      IVar20 = (IVal)(dVar26 <= (double)local_448._M_allocated_capacity && dStack_450 <= dVar27);
      if ((NAN(fVar2)) &&
         (dVar26 <= (double)local_448._M_allocated_capacity && dStack_450 <= dVar27)) {
        local_508.m_hasNaN = local_458[0];
        IVar20 = (IVal)local_508.m_hasNaN;
      }
      local_458 = (undefined1  [8])&local_448;
      local_508._0_8_ = uVar17;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar20 & 1),(string *)local_458);
      if (local_458 != (undefined1  [8])&local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
      }
      iVar16 = iVar16 + ((byte)~(bVar14 && bVar15) & 1);
      if (iVar16 < 0x65 && (!bVar14 || !bVar15)) {
        local_458 = (undefined1  [8])local_518;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
        pcVar22 = "Failed";
        if (bVar14 && bVar15) {
          pcVar22 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,pcVar22,6);
        ppdVar11 = (double **)&local_240.m_hi;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
        pVVar8 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_240._0_8_ = ppdVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa98,&local_a8,
                   (float *)((long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar25));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                   (long)local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_564,in_stack_fffffffffffffa98) != &local_558) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                          (ulong)(local_558._M_allocated_capacity + 1));
        }
        if ((double **)local_240._0_8_ != ppdVar11) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
        pVVar8 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_240._0_8_ = ppdVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa98,&local_a8,
                   (float *)((long)local_488.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar25));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                   (long)local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,"\tExpected range: ",0x11);
        intervalToString<float>(&local_538,&local_a8,&local_508);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,local_538._M_dataplus._M_p,local_538._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_564,in_stack_fffffffffffffa98) != &local_558) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                          (ulong)(local_558._M_allocated_capacity + 1));
        }
        if ((double **)local_240._0_8_ != ppdVar11) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\t",1);
        pVVar10 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>.m_ptr;
        pcVar9 = (pVVar10->m_name)._M_dataplus._M_p;
        local_240._0_8_ = ppdVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar9,pcVar9 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)local_240._0_8_,(long)local_240.m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," = ",3);
        valueToString<int>((string *)&stack0xfffffffffffffa98,&local_a8,
                           (int *)((long)local_488.out1.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar25));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,(char *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                   (long)local_560);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,"\tExpected range: ",0x11);
        intervalToString<int>(&local_538,&local_a8,&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_450,local_538._M_dataplus._M_p,local_538._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_564,in_stack_fffffffffffffa98) != &local_558) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_564,in_stack_fffffffffffffa98),
                          (ulong)(local_558._M_allocated_capacity + 1));
        }
        if ((double **)local_240._0_8_ != ppdVar11) {
          operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
        std::ios_base::~ios_base(local_3e0);
      }
      lVar25 = lVar25 + 4;
      lVar24 = local_4c8 + -1;
      pFVar21 = local_4d0;
    } while (lVar24 != 0);
  }
  pTVar12 = local_4c0;
  if (100 < iVar16) {
    local_458 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&dStack_450,iVar16 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  if (iVar16 == 0) {
    local_458 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_458 = (undefined1  [8])local_518;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_450);
    std::ostream::operator<<((ostringstream *)&dStack_450,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_450);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_450," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_450);
  std::ios_base::~ios_base(local_3e0);
  if (iVar16 == 0) {
    local_458 = (undefined1  [8])&local_448;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"Pass","");
    pTVar12->m_code = QP_TEST_RESULT_PASS;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_458,
               (char *)((long)local_458 + (long)dStack_450));
    uVar17 = local_448._M_allocated_capacity;
    auVar23 = local_458;
    if (local_458 == (undefined1  [8])&local_448) goto LAB_009de452;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
    std::ostream::operator<<(local_458,iVar16);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
    std::ios_base::~ios_base(local_3e8);
    local_458 = (undefined1  [8])&local_448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458," test failed. Check log for the details","");
    uVar17 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_564,in_stack_fffffffffffffa98) != &local_558) {
      uVar17 = local_558._M_allocated_capacity;
    }
    if ((ulong)uVar17 < (_Base_ptr)((long)dStack_450 + (long)local_560)) {
      uVar17 = (_Base_ptr)0xf;
      if (local_458 != (undefined1  [8])&local_448) {
        uVar17 = local_448._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (_Base_ptr)((long)dStack_450 + (long)local_560)) goto LAB_009de2ea;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_458,0,(char *)0x0,
                           CONCAT44(uStack_564,in_stack_fffffffffffffa98));
    }
    else {
LAB_009de2ea:
      puVar19 = (undefined8 *)
                std::__cxx11::string::_M_append(&stack0xfffffffffffffa98,(ulong)local_458);
    }
    local_240._0_8_ = &local_240.m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_240.m_hi = *pdVar1;
      uStack_228 = *(undefined4 *)(puVar19 + 3);
      uStack_224 = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_240.m_hi = *pdVar1;
      local_240._0_8_ = (double *)*puVar19;
    }
    local_240.m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar12->m_code = QP_TEST_RESULT_FAIL;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_240._0_8_,
               (undefined1 *)((long)local_240.m_lo + local_240._0_8_));
    if ((double *)local_240._0_8_ != &local_240.m_hi) {
      operator_delete((void *)local_240._0_8_,(long)local_240.m_hi + 1);
    }
    if (local_458 != (undefined1  [8])&local_448) {
      operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
    }
    auVar23 = (undefined1  [8])CONCAT44(uStack_564,in_stack_fffffffffffffa98);
    uVar17 = local_558._M_allocated_capacity;
    if (auVar23 == (undefined1  [8])&local_558) goto LAB_009de452;
  }
  operator_delete((void *)auVar23,(ulong)((long)&((_Base_ptr)uVar17)->_M_color + 1));
LAB_009de452:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4b8);
  if (local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.out1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_488.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_488.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar12;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}